

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

void __thiscall
duckdb_jaro_winkler::common::PatternMatchVector::insert<char_const*>
          (PatternMatchVector *this,char *first,char *last)

{
  unsigned_long *puVar1;
  char key;
  long lVar2;
  ulong mask;
  long lVar3;
  
  lVar3 = 0;
  lVar2 = (long)last - (long)first;
  if ((long)last - (long)first < 1) {
    lVar2 = lVar3;
  }
  mask = 1;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    key = first[lVar3];
    if ((long)key < 0) {
      BitvectorHashmap::insert_mask<char>(&this->m_map,key,mask);
    }
    else {
      puVar1 = (this->m_extendedAscii)._M_elems + key;
      *puVar1 = *puVar1 | mask;
    }
    mask = mask * 2;
  }
  return;
}

Assistant:

void insert(InputIt1 first, InputIt1 last)
    {
        uint64_t mask = 1;
        for (int64_t i = 0; i < std::distance(first, last); ++i) {
            auto key = first[i];
            if (key >= 0 && key <= 255) {
                m_extendedAscii[static_cast<size_t>(key)] |= mask;
            }
            else {
                m_map.insert_mask(key, mask);
            }
            mask <<= 1;
        }
    }